

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O2

avl_node * avl_find_greaterequal(avl_tree *tree,void *key)

{
  avl_node *paVar1;
  avl_node *paVar2;
  uint local_2c;
  
  if (tree->root == (avl_node *)0x0) {
LAB_00103b06:
    paVar1 = (avl_node *)0x0;
  }
  else {
    paVar1 = _avl_find_rec(tree->root,key,tree->comp,(int *)&local_2c);
    while (paVar2 = paVar1, 0 < (int)local_2c) {
      if ((avl_node *)(tree->list_head).prev == paVar1) goto LAB_00103b06;
      paVar1 = (avl_node *)(paVar1->list).next;
      local_2c = (*tree->comp)(key,paVar1->key);
    }
    while (((int)local_2c < 1 && (paVar1 = paVar2, (avl_node *)(tree->list_head).next != paVar2))) {
      paVar2 = (avl_node *)(paVar2->list).prev;
      local_2c = (*tree->comp)(key,paVar2->key);
    }
  }
  return paVar1;
}

Assistant:

struct avl_node *
avl_find_greaterequal(const struct avl_tree *tree, const void *key) {
  struct avl_node *node, *next;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  /* go right as long as key>node.key */
  while (diff > 0) {
    if (list_is_last(&tree->list_head, &node->list)) {
      return NULL;
    }

    node = (struct avl_node *)node->list.next;
    diff = (*tree->comp)(key, node->key);
  }

  /* go left as long as key<=next_node.key */
  next = node;
  while (diff <= 0) {
    node = next;
    if (list_is_first(&tree->list_head, &node->list)) {
      break;
    }

    next = (struct avl_node *)node->list.prev;
    diff = (*tree->comp)(key, next->key);
  }
  return node;
}